

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::applyFilenamesAsTags(IConfig *config)

{
  pointer pTVar1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  
  pvVar2 = getAllTestCasesSorted(config);
  lVar4 = 0;
  for (uVar5 = 0;
      pTVar1 = (pvVar2->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(pvVar2->
                             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x118);
      uVar5 = uVar5 + 1) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&tags._M_t,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&(pTVar1->super_TestCaseInfo).tags._M_t + lVar4));
    std::__cxx11::string::string
              ((string *)&filename,
               (string *)((long)&(pTVar1->super_TestCaseInfo).lineInfo.file + lVar4));
    lVar3 = std::__cxx11::string::find_last_of((char *)&filename,0x186913);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&filename);
      std::__cxx11::string::operator=((string *)&filename,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    lVar3 = std::__cxx11::string::find_last_of((char *)&filename,0x188e57);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&filename);
      std::__cxx11::string::operator=((string *)&filename,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::operator+(&local_a0,"#",&filename);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tags,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    setTags((TestCaseInfo *)((long)&(pTVar1->super_TestCaseInfo).name._M_dataplus + lVar4),&tags);
    std::__cxx11::string::~string((string *)&filename);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tags);
    lVar4 = lVar4 + 0x118;
  }
  return;
}

Assistant:

void applyFilenamesAsTags( IConfig const& config ) {
        std::vector<TestCase> const& tests = getAllTestCasesSorted( config );
        for(std::size_t i = 0; i < tests.size(); ++i ) {
            TestCase& test = const_cast<TestCase&>( tests[i] );
            std::set<std::string> tags = test.tags;

            std::string filename = test.lineInfo.file;
            std::string::size_type lastSlash = filename.find_last_of( "\\/" );
            if( lastSlash != std::string::npos )
                filename = filename.substr( lastSlash+1 );

            std::string::size_type lastDot = filename.find_last_of( "." );
            if( lastDot != std::string::npos )
                filename = filename.substr( 0, lastDot );

            tags.insert( "#" + filename );
            setTags( test, tags );
        }
    }